

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall
pugi::xml_node::insert_attribute_before(xml_node *this,char_t *name_,xml_attribute *attr)

{
  xml_node_struct *node;
  xml_attribute_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  bool bVar3;
  uint uVar4;
  xml_allocator *alloc;
  xml_attribute_struct *pxVar5;
  xml_attribute_struct **ppxVar6;
  xml_attribute a;
  xml_attribute local_28;
  
  node = this->_root;
  if (((node != (xml_node_struct *)0x0) &&
      (((uVar4 = (uint)node->header & 0xf, uVar4 == 7 || (uVar4 == 2)) &&
       (attr->_attr != (xml_attribute_struct *)0x0)))) &&
     (bVar3 = impl::anon_unknown_0::is_attribute_of(attr->_attr,node), bVar3)) {
    alloc = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(node);
    pxVar5 = impl::anon_unknown_0::allocate_attribute(alloc);
    if (pxVar5 == (xml_attribute_struct *)0x0) {
      return (xml_attribute)(xml_attribute_struct *)0x0;
    }
    pxVar1 = attr->_attr;
    pxVar2 = pxVar1->prev_attribute_c;
    ppxVar6 = &this->_root->first_attribute;
    if (pxVar2->next_attribute != (xml_attribute_struct *)0x0) {
      ppxVar6 = &pxVar2->next_attribute;
    }
    *ppxVar6 = pxVar5;
    pxVar5->prev_attribute_c = pxVar2;
    pxVar5->next_attribute = pxVar1;
    pxVar1->prev_attribute_c = pxVar5;
    local_28._attr = pxVar5;
    xml_attribute::set_name(&local_28,name_);
    return (xml_attribute)pxVar5;
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI__FN xml_node_type xml_node::type() const
	{
		return _root ? PUGI__NODETYPE(_root) : node_null;
	}